

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

int __thiscall
EnvironmentNAVXYTHETALATTICE::GetEnvParameter(EnvironmentNAVXYTHETALATTICE *this,char *parameter)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  SBPL_Exception *this_00;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  iVar1 = strcmp(parameter,"cost_inscribed_thresh");
  if (iVar1 == 0) {
    uVar2 = (uint)(this->EnvNAVXYTHETALATCfg).cost_inscribed_thresh;
  }
  else {
    iVar1 = strcmp(parameter,"cost_possibly_circumscribed_thresh");
    if (iVar1 == 0) {
      uVar2 = (this->EnvNAVXYTHETALATCfg).cost_possibly_circumscribed_thresh;
    }
    else {
      iVar1 = strcmp(parameter,"cost_obsthresh");
      if (iVar1 != 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar3 = std::operator<<(local_190,"ERROR: invalid parameter ");
        std::operator<<(poVar3,parameter);
        this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        SBPL_Exception::SBPL_Exception(this_00,&local_1c0);
        __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar2 = (uint)(this->EnvNAVXYTHETALATCfg).obsthresh;
    }
  }
  return uVar2;
}

Assistant:

int EnvironmentNAVXYTHETALATTICE::GetEnvParameter(const char* parameter)
{
    if (strcmp(parameter, "cost_inscribed_thresh") == 0) {
        return (int)EnvNAVXYTHETALATCfg.cost_inscribed_thresh;
    }
    else if (strcmp(parameter, "cost_possibly_circumscribed_thresh") == 0) {
        return (int)EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh;
    }
    else if (strcmp(parameter, "cost_obsthresh") == 0) {
        return (int)EnvNAVXYTHETALATCfg.obsthresh;
    }
    else {
        std::stringstream ss;
        ss << "ERROR: invalid parameter " << parameter;
        throw SBPL_Exception(ss.str());
    }
}